

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::FeatureFilter::Impl::dependency_flags_is_supported(Impl *this,VkDependencyFlags deps)

{
  if (((deps < 0x10) &&
      ((deps < 8 ||
       ((this->features).attachment_feedback_loop_layout.attachmentFeedbackLoopLayout != 0)))) &&
     (((deps & 2) == 0 || ((this->features).multiview.multiview != 0)))) {
    return 0x400fff < this->api_version || (deps & 4) == 0;
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::dependency_flags_is_supported(VkDependencyFlags deps) const
{
	constexpr VkDependencyFlags supported_flags = VK_DEPENDENCY_BY_REGION_BIT |
	                                              VK_DEPENDENCY_FEEDBACK_LOOP_BIT_EXT |
	                                              VK_DEPENDENCY_VIEW_LOCAL_BIT |
	                                              VK_DEPENDENCY_DEVICE_GROUP_BIT;

	if ((deps & ~supported_flags) != 0)
		return false;

	if ((deps & VK_DEPENDENCY_FEEDBACK_LOOP_BIT_EXT) != 0)
		if (!features.attachment_feedback_loop_layout.attachmentFeedbackLoopLayout)
			return false;

	if ((deps & VK_DEPENDENCY_VIEW_LOCAL_BIT) != 0)
		if (!features.multiview.multiview)
			return false;

	if ((deps & VK_DEPENDENCY_DEVICE_GROUP_BIT) != 0 && api_version < VK_API_VERSION_1_1)
		return false;

	return true;
}